

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

void IoTHubMessaging_LL_SenderStateChanged
               (void *context,MESSAGE_SENDER_STATE new_state,MESSAGE_SENDER_STATE previous_state)

{
  IOTHUB_MESSAGING *messagingData;
  MESSAGE_SENDER_STATE previous_state_local;
  MESSAGE_SENDER_STATE new_state_local;
  void *context_local;
  
  if (context != (void *)0x0) {
    *(MESSAGE_SENDER_STATE *)((long)context + 0x98) = new_state;
    if ((*(int *)((long)context + 0x98) == 3) && (*(int *)((long)context + 0x9c) == 3)) {
      *(undefined4 *)context = 1;
      if (*(long *)((long)context + 0xa0) != 0) {
        (**(code **)((long)context + 0xa0))(*(undefined8 *)((long)context + 0xa8));
      }
    }
    else {
      *(undefined4 *)context = 0;
    }
  }
  return;
}

Assistant:

static void IoTHubMessaging_LL_SenderStateChanged(void* context, MESSAGE_SENDER_STATE new_state, MESSAGE_SENDER_STATE previous_state)
{
    (void)previous_state;
    if (context != NULL)
    {
        IOTHUB_MESSAGING* messagingData = (IOTHUB_MESSAGING*)context;
        messagingData->message_sender_state = new_state;

        if ((messagingData->message_sender_state == MESSAGE_SENDER_STATE_OPEN) && (messagingData->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            messagingData->isOpened = true;
            if (messagingData->callback_data.openCompleteCompleteCallback != NULL)
            {
                (messagingData->callback_data.openCompleteCompleteCallback)(messagingData->callback_data.openUserContext);
            }
        }
        else
        {
            messagingData->isOpened = false;
        }
    }
}